

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O0

ShuffleVectorInst * LLVMBC::dyn_cast<LLVMBC::ShuffleVectorInst>(Value *value)

{
  bool bVar1;
  ValueKind kind;
  Value *value_local;
  
  if (value == (Value *)0x0) {
    value_local = (Value *)0x0;
  }
  else {
    value_local = Internal::resolve_proxy(value);
    kind = Value::get_value_kind(value_local);
    bVar1 = ShuffleVectorInst::is_base_of_value_kind(kind);
    if (!bVar1) {
      value_local = (Value *)0x0;
    }
  }
  return (ShuffleVectorInst *)value_local;
}

Assistant:

inline const T *dyn_cast(const Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<const T *>(value);
	else
		return nullptr;
}